

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall
Js::JITPageAddrToFuncRangeCache::RemoveFuncRange(JITPageAddrToFuncRangeCache *this,void *address)

{
  code *pcVar1;
  void *buffer;
  bool bVar2;
  undefined4 *puVar3;
  void *local_38;
  void *pageAddr;
  void *pvStack_28;
  uint bytes;
  void *address_local;
  RangeMap *rangeMap;
  
  pvStack_28 = address;
  CCLock::Enter((CCLock *)&cs);
  local_38 = (void *)(ulong)((uint)pvStack_28 & 0xfffff000);
  address_local = (void *)0x0;
  pageAddr._4_4_ = 0;
  if (this->jitPageAddrToFuncRangeMap != (JITPageAddrToFuncRangeMap *)0x0) {
    bVar2 = JsUtil::
            BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<void*>
                      ((BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this->jitPageAddrToFuncRangeMap,&local_38,
                       (BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        **)&address_local);
    if (bVar2) {
      if (*(int *)((long)address_local + 0x20) == *(int *)((long)address_local + 0x28)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x1af5,"(rangeMap->Count() != 0)","rangeMap->Count() != 0");
        if (!bVar2) goto LAB_0079c4ff;
        *puVar3 = 0;
      }
      JsUtil::
      BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Remove((BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)address_local,&stack0xffffffffffffffd8);
      buffer = address_local;
      if (*(int *)((long)address_local + 0x20) == *(int *)((long)address_local + 0x28)) {
        JsUtil::
        BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::~BaseDictionary((BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           *)address_local);
        Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,0x38);
        address_local = (void *)0x0;
        JsUtil::
        BaseDictionary<void_*,_JsUtil::BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Remove(this->jitPageAddrToFuncRangeMap,&local_38);
      }
      goto LAB_0079c4ea;
    }
  }
  if (this->largeJitFuncToSizeMap != (LargeJITFuncAddrToSizeMap *)0x0) {
    bVar2 = JsUtil::
            BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<void*>
                      ((BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this->largeJitFuncToSizeMap,&stack0xffffffffffffffd8,
                       (uint *)((long)&pageAddr + 4));
    if (bVar2) {
      JsUtil::
      BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Remove(this->largeJitFuncToSizeMap,&stack0xffffffffffffffd8);
      goto LAB_0079c4ea;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                              ,0x1b06,"(false)","Page address not found to remove the func range");
  if (!bVar2) {
LAB_0079c4ff:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_0079c4ea:
  CCLock::Leave((CCLock *)&cs);
  return;
}

Assistant:

void JITPageAddrToFuncRangeCache::RemoveFuncRange(void * address)
    {
        AutoCriticalSection autocs(GetCriticalSection());

        void * pageAddr = GetPageAddr(address);

        RangeMap * rangeMap = nullptr;
        uint bytes = 0;
        if (jitPageAddrToFuncRangeMap && jitPageAddrToFuncRangeMap->TryGetValue(pageAddr, &rangeMap))
        {
            Assert(rangeMap->Count() != 0);
            rangeMap->Remove(address);

            if (rangeMap->Count() == 0)
            {
                HeapDelete(rangeMap);
                rangeMap = nullptr;
                jitPageAddrToFuncRangeMap->Remove(pageAddr);
            }
            return;
        }
        else if (largeJitFuncToSizeMap && largeJitFuncToSizeMap->TryGetValue(address, &bytes))
        {
            largeJitFuncToSizeMap->Remove(address);
        }
        else
        {
            AssertMsg(false, "Page address not found to remove the func range");
        }
    }